

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

string * __thiscall
bloaty::(anonymous_namespace)::PercentString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double percent,bool diff_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  long *plVar3;
  size_type *psVar4;
  undefined7 in_register_00000011;
  char *pcVar5;
  char *fmt;
  char *pcVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  string str;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  double local_a0;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [16];
  
  pcVar5 = (char *)CONCAT71(in_register_00000011,diff_mode);
  if ((int)this == 0) {
    DoubleStringPrintf_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)"%5.1F%%",pcVar5,percent);
    return __return_storage_ptr__;
  }
  if (percent == 0.0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = " [ = ]";
    pcVar5 = "";
LAB_0017d4b7:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
    return __return_storage_ptr__;
  }
  if ((percent == -100.0) && (!NAN(percent))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = " [DEL]";
    pcVar5 = "";
    goto LAB_0017d4b7;
  }
  if (ABS(percent) == INFINITY) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = " [NEW]";
    pcVar5 = "";
    goto LAB_0017d4b7;
  }
  paVar1 = &local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  if (percent <= 1000.0) {
    if (percent <= 10.0) {
      DoubleStringPrintf_abi_cxx11_(&local_100,(_anonymous_namespace_ *)"%+5.1F%%",pcVar5,percent);
    }
    else {
      DoubleStringPrintf_abi_cxx11_(&local_100,(_anonymous_namespace_ *)"%+4.0f%%",pcVar5,percent);
    }
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_100);
    local_78.field_2._M_allocated_capacity = local_100.field_2._M_allocated_capacity;
    local_78._M_dataplus._M_p = local_100._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_0017d729;
  }
  else {
    local_a0 = percent;
    dVar2 = log10(percent);
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._0_8_ = dVar2 + -1.0;
    local_38._12_4_ = extraout_XMM0_Dd;
    dVar2 = pow(10.0,(double)(int)(dVar2 + -1.0));
    DoubleStringPrintf_abi_cxx11_(&local_78,(_anonymous_namespace_ *)"%+2.0f",fmt,local_a0 / dVar2);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_e0.field_2._M_allocated_capacity = *psVar4;
      local_e0.field_2._8_8_ = plVar3[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar4;
      local_e0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_e0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::to_string(&local_98,(int)(double)local_38._0_8_);
    std::operator+(&local_58,&local_e0,&local_98);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_100.field_2._M_allocated_capacity = *psVar4;
      local_100.field_2._8_8_ = plVar3[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar4;
      local_100._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_100._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_0017d729;
  }
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
LAB_0017d729:
  anon_unknown_35::LeftPad(__return_storage_ptr__,&local_c0,6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar1) {
    return __return_storage_ptr__;
  }
  operator_delete(local_c0._M_dataplus._M_p,
                  CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                           local_c0.field_2._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string PercentString(double percent, bool diff_mode) {
  if (diff_mode) {
    if (percent == 0 || std::isnan(percent)) {
      return " [ = ]";
    } else if (percent == -100) {
      return " [DEL]";
    } else if (std::isinf(percent)) {
      return " [NEW]";
    } else {
      // We want to keep this fixed-width even if the percent is very large.
      std::string str;
      if (percent > 1000) {
        int digits = log10(percent) - 1;
        str = DoubleStringPrintf("%+2.0f", percent / pow(10, digits)) + "e" +
              std::to_string(digits) + "%";
      } else if (percent > 10) {
        str = DoubleStringPrintf("%+4.0f%%", percent);
      } else {
        str = DoubleStringPrintf("%+5.1F%%", percent);
      }

      return LeftPad(str, 6);
    }
  } else {
    return DoubleStringPrintf("%5.1F%%", percent);
  }
}